

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ItemSimilarityRecommender::SharedDtor(ItemSimilarityRecommender *this)

{
  string *psVar1;
  ItemSimilarityRecommender *pIVar2;
  ItemSimilarityRecommender *this_local;
  
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena(&this->iteminputfeaturename_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->numrecommendationsinputfeaturename_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->itemrestrictioninputfeaturename_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->itemexclusioninputfeaturename_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->recommendeditemlistoutputfeaturename_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->recommendeditemscoreoutputfeaturename_,psVar1);
  pIVar2 = internal_default_instance();
  if ((this != pIVar2) && (this->itemstringids_ != (StringVector *)0x0)) {
    (*(this->itemstringids_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pIVar2 = internal_default_instance();
  if ((this != pIVar2) && (this->itemint64ids_ != (Int64Vector *)0x0)) {
    (*(this->itemint64ids_->super_MessageLite)._vptr_MessageLite[1])();
  }
  return;
}

Assistant:

void ItemSimilarityRecommender::SharedDtor() {
  iteminputfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  numrecommendationsinputfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  itemrestrictioninputfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  itemexclusioninputfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  recommendeditemlistoutputfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  recommendeditemscoreoutputfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) {
    delete itemstringids_;
  }
  if (this != internal_default_instance()) {
    delete itemint64ids_;
  }
}